

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::ForEachOverlapping
          (Version *this,Slice user_key,Slice internal_key,void *arg,
          _func_bool_void_ptr_int_FileMetaData_ptr *func)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  reference ppFVar6;
  Slice SVar7;
  Slice local_d8;
  value_type local_c8;
  FileMetaData *f_1;
  size_type sStack_b8;
  uint32_t index;
  size_t num_files;
  undefined4 local_a8;
  int level;
  iterator iStack_a0;
  uint32_t i_1;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_98;
  Slice local_90;
  Slice local_80;
  value_type local_70;
  FileMetaData *f;
  uint32_t i;
  undefined1 local_58 [8];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  Comparator *ucmp;
  void *arg_local;
  Version *this_local;
  Slice internal_key_local;
  Slice user_key_local;
  
  internal_key_local.data_ = (char *)internal_key.size_;
  this_local = (Version *)internal_key.data_;
  internal_key_local.size_ = (size_t)user_key.data_;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)InternalKeyComparator::user_comparator(&this->vset_->icmp_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_58);
  sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->files_);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_58,
             sVar4);
  f._0_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(uint)f;
    sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (this->files_);
    if (sVar4 <= uVar5) break;
    ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](this->files_,(ulong)(uint)f);
    ppFVar1 = tmp.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70 = *ppFVar6;
    SVar7 = InternalKey::user_key(&local_70->smallest);
    local_80 = SVar7;
    iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_80);
    ppFVar1 = tmp.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar2 = false;
    if (-1 < iVar3) {
      SVar7 = InternalKey::user_key(&local_70->largest);
      local_90 = SVar7;
      iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_90);
      bVar2 = iVar3 < 1;
    }
    if (bVar2) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 local_58,&local_70);
    }
    f._0_4_ = (uint)f + 1;
  }
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     local_58);
  if (!bVar2) {
    local_98._M_current =
         (FileMetaData **)
         std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                   ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    local_58);
    iStack_a0 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_58);
    std::
    sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>
              (local_98,(__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                         )iStack_a0._M_current,NewestFirst);
    level = 0;
    while( true ) {
      uVar5 = (ulong)(uint)level;
      sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)local_58);
      if (sVar4 <= uVar5) break;
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)local_58,(ulong)(uint)level);
      bVar2 = (*func)(arg,0,*ppFVar6);
      if (!bVar2) {
        local_a8 = 1;
        goto LAB_0011072a;
      }
      level = level + 1;
    }
  }
  num_files._4_4_ = 1;
  do {
    if (6 < num_files._4_4_) {
      local_a8 = 0;
LAB_0011072a:
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 local_58);
      return;
    }
    sStack_b8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          (this->files_ + num_files._4_4_);
    if (sStack_b8 != 0) {
      f_1._4_4_ = FindFile(&this->vset_->icmp_,this->files_ + num_files._4_4_,(Slice *)&this_local);
      if (f_1._4_4_ < sStack_b8) {
        ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[](this->files_ + num_files._4_4_,(ulong)f_1._4_4_);
        ppFVar1 = tmp.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8 = *ppFVar6;
        SVar7 = InternalKey::user_key(&local_c8->smallest);
        local_d8 = SVar7;
        iVar3 = (*(code *)(*ppFVar1)->file_size)(ppFVar1,&internal_key_local.size_,&local_d8);
        if (-1 < iVar3) {
          bVar2 = (*func)(arg,num_files._4_4_,local_c8);
          if (!bVar2) {
            local_a8 = 1;
            goto LAB_0011072a;
          }
        }
      }
    }
    num_files._4_4_ = num_files._4_4_ + 1;
  } while( true );
}

Assistant:

void Version::ForEachOverlapping(Slice user_key, Slice internal_key, void* arg,
                                 bool (*func)(void*, int, FileMetaData*)) {
  // TODO(sanjay): Change Version::Get() to use this function.
  const Comparator* ucmp = vset_->icmp_.user_comparator();

  // Search level-0 in order from newest to oldest.
  std::vector<FileMetaData*> tmp;
  tmp.reserve(files_[0].size());
  for (uint32_t i = 0; i < files_[0].size(); i++) {
    FileMetaData* f = files_[0][i];
    if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
        ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
      tmp.push_back(f);
    }
  }
  if (!tmp.empty()) {
    std::sort(tmp.begin(), tmp.end(), NewestFirst);
    for (uint32_t i = 0; i < tmp.size(); i++) {
      if (!(*func)(arg, 0, tmp[i])) {
        return;
      }
    }
  }

  // Search other levels.
  for (int level = 1; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Binary search to find earliest index whose largest key >= internal_key.
    uint32_t index = FindFile(vset_->icmp_, files_[level], internal_key);
    if (index < num_files) {
      FileMetaData* f = files_[level][index];
      if (ucmp->Compare(user_key, f->smallest.user_key()) < 0) {
        // All of "f" is past any data for user_key
      } else {
        if (!(*func)(arg, level, f)) {
          return;
        }
      }
    }
  }
}